

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::
RegisterTests(ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest> *this)

{
  bool bVar1;
  undefined1 condition;
  undefined1 uVar2;
  int iVar3;
  pointer pIVar4;
  ulong uVar5;
  element_type *peVar6;
  tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>
  *a_param;
  ostream *poVar7;
  size_type sVar8;
  void *this_00;
  char *filename;
  tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>
  *ptVar9;
  undefined4 extraout_var;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  bool in_stack_00000127;
  CodeLocation *in_stack_00000128;
  string *in_stack_00000130;
  string param_name;
  Message test_name_stream;
  iterator param_it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  size_t i;
  string test_suite_name;
  int line;
  char *file;
  ParamNameGeneratorFunc *name_func;
  ParamGenerator<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
  generator;
  string *instantiation_name;
  iterator gen_it;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>
  test_info;
  iterator test_it;
  bool generated_instantiations;
  CodeLocation *in_stack_fffffffffffffcb8;
  CodeLocation *in_stack_fffffffffffffcc0;
  string *in_stack_fffffffffffffcc8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcd0;
  value_type *in_stack_fffffffffffffcd8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffce8;
  pointer in_stack_fffffffffffffcf0;
  CodeLocation *in_stack_fffffffffffffd08;
  tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>
  *in_stack_fffffffffffffd28;
  int line_00;
  char *in_stack_fffffffffffffd30;
  Message *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  void *in_stack_fffffffffffffd98;
  CodeLocation *in_stack_fffffffffffffda0;
  ostream *in_stack_fffffffffffffda8;
  ostream *in_stack_fffffffffffffdb0;
  ostream *in_stack_fffffffffffffdb8;
  ostream *in_stack_fffffffffffffdc0;
  undefined6 in_stack_fffffffffffffdd0;
  ParamNameGeneratorFunc *tear_down_tc;
  _Head_base<1UL,_int,_false> local_1d8;
  int iStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  string local_1a0 [8];
  tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>
  *in_stack_fffffffffffffe68;
  string local_180 [32];
  _Base_ptr local_160;
  undefined1 local_158;
  GTestLog local_150;
  GTestLog local_14c;
  TestParamInfo<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
  local_148;
  string local_130 [3];
  size_t local_c8;
  string local_c0 [32];
  string local_a0 [36];
  int local_7c;
  char *local_78;
  ParamNameGeneratorFunc *local_70;
  undefined1 local_58 [16];
  pointer local_48;
  InstantiationInfo *local_40;
  __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo>_>_>
  local_38 [3];
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>
  *local_20;
  __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>_>_>_>
  local_18;
  byte local_9;
  
  local_9 = 0;
  local_18._M_current =
       (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>
        *)std::
          vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>_>_>
          ::begin((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>_>_>
                   *)in_stack_fffffffffffffcb8);
  while( true ) {
    local_20 = (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>
                *)std::
                  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>_>_>
                  ::end((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>_>_>
                         *)in_stack_fffffffffffffcb8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>_>_>_>
                        *)in_stack_fffffffffffffcc0,
                       (__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>_>_>_>
                        *)in_stack_fffffffffffffcb8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>_>_>_>
    ::operator*(&local_18);
    std::
    shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>
    ::shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>
                  *)in_stack_fffffffffffffcc0,
                 (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>
                  *)in_stack_fffffffffffffcb8);
    local_38[0]._M_current =
         (InstantiationInfo *)
         std::
         vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo>_>
         ::begin((vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo>_>
                  *)in_stack_fffffffffffffcb8);
    while( true ) {
      local_40 = (InstantiationInfo *)
                 std::
                 vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo>_>
                 ::end((vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo>_>
                        *)in_stack_fffffffffffffcb8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo>_>_>
                          *)in_stack_fffffffffffffcc0,
                         (__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo>_>_>
                          *)in_stack_fffffffffffffcb8);
      if (!bVar1) break;
      local_48 = __gnu_cxx::
                 __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo>_>_>
                 ::operator->(local_38);
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo>_>_>
               ::operator->(local_38);
      (*pIVar4->generator)(local_58);
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_70 = pIVar4->name_func;
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_78 = pIVar4->file;
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_7c = pIVar4->line;
      std::__cxx11::string::string(local_a0);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::operator+(in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
        std::__cxx11::string::operator=(local_a0,local_c0);
        std::__cxx11::string::~string(local_c0);
      }
      peVar6 = std::
               __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0xd7ff0e);
      std::__cxx11::string::operator+=(local_a0,(string *)peVar6);
      local_c8 = 0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0xd7ff39);
      ParamGenerator<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
      ::begin((ParamGenerator<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
               *)in_stack_fffffffffffffcc8);
      while( true ) {
        ParamGenerator<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
        ::end((ParamGenerator<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
               *)in_stack_fffffffffffffcc8);
        bVar1 = ParamIterator<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
                ::operator!=((ParamIterator<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
                              *)in_stack_fffffffffffffcc0,
                             (ParamIterator<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
                              *)in_stack_fffffffffffffcb8);
        ParamIterator<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
        ::~ParamIterator((ParamIterator<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
                          *)0xd7ff94);
        iVar3 = (int)((ulong)in_stack_fffffffffffffd08 >> 0x20);
        line_00 = (int)((ulong)in_stack_fffffffffffffd28 >> 0x20);
        if (!bVar1) break;
        local_9 = 1;
        Message::Message((Message *)in_stack_fffffffffffffcf0);
        tear_down_tc = local_70;
        a_param = ParamIterator<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
                  ::operator*((ParamIterator<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
                               *)0xd8003d);
        TestParamInfo<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
        ::TestParamInfo(&local_148,a_param,local_c8);
        (*tear_down_tc)(local_130,&local_148);
        condition = IsValidParamName(in_stack_fffffffffffffcc8);
        uVar2 = IsTrue((bool)condition);
        if (!(bool)uVar2) {
          GTestLog::GTestLog((GTestLog *)
                             CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                             (GTestLogSeverity)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                             in_stack_fffffffffffffd30,line_00);
          poVar7 = GTestLog::GetStream(&local_14c);
          poVar7 = std::operator<<(poVar7,"Condition IsValidParamName(param_name) failed. ");
          in_stack_fffffffffffffdc0 = std::operator<<(poVar7,"Parameterized test name \'");
          in_stack_fffffffffffffdb8 = std::operator<<(in_stack_fffffffffffffdc0,(string *)local_130)
          ;
          in_stack_fffffffffffffdb0 =
               std::operator<<(in_stack_fffffffffffffdb8,"\' is invalid, in ");
          in_stack_fffffffffffffda8 = std::operator<<(in_stack_fffffffffffffdb0,local_78);
          in_stack_fffffffffffffda0 =
               (CodeLocation *)std::operator<<(in_stack_fffffffffffffda8," line ");
          in_stack_fffffffffffffd98 =
               (void *)std::ostream::operator<<(in_stack_fffffffffffffda0,local_7c);
          std::ostream::operator<<(in_stack_fffffffffffffd98,std::endl<char,std::char_traits<char>>)
          ;
          GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffcc0);
        }
        sVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
        bVar1 = IsTrue(sVar8 == 0);
        if (!bVar1) {
          GTestLog::GTestLog((GTestLog *)
                             CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                             (GTestLogSeverity)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                             in_stack_fffffffffffffd30,line_00);
          poVar7 = GTestLog::GetStream(&local_150);
          poVar7 = std::operator<<(poVar7,
                                   "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar7 = std::operator<<(poVar7,"Duplicate parameterized test name \'");
          poVar7 = std::operator<<(poVar7,(string *)local_130);
          poVar7 = std::operator<<(poVar7,"\', in ");
          poVar7 = std::operator<<(poVar7,local_78);
          poVar7 = std::operator<<(poVar7," line ");
          this_00 = (void *)std::ostream::operator<<(poVar7,local_7c);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffcc0);
        }
        pVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        local_160 = (_Base_ptr)pVar10.first._M_node;
        in_stack_fffffffffffffd47 = pVar10.second;
        local_158 = in_stack_fffffffffffffd47;
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0xd80426);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          std::
          __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0xd80443);
          in_stack_fffffffffffffd38 =
               Message::operator<<((Message *)in_stack_fffffffffffffcc0,
                                   &in_stack_fffffffffffffcb8->file);
          Message::operator<<((Message *)in_stack_fffffffffffffcc0,
                              (char (*) [2])in_stack_fffffffffffffcb8);
        }
        Message::operator<<((Message *)in_stack_fffffffffffffcc0,&in_stack_fffffffffffffcb8->file);
        in_stack_fffffffffffffd30 = (char *)std::__cxx11::string::c_str();
        Message::GetString_abi_cxx11_((Message *)in_stack_fffffffffffffcc8);
        std::__cxx11::string::c_str();
        in_stack_fffffffffffffd28 =
             ParamIterator<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
             ::operator*((ParamIterator<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
                          *)0xd804d8);
        PrintToString<std::tuple<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,int,int,ConvolveParams*),std::tuple<int,int>>>
                  (in_stack_fffffffffffffe68);
        std::__cxx11::string::c_str();
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0xd80512);
        CodeLocation::CodeLocation(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
        filename = (char *)(**(code **)(*in_RDI + 0x18))();
        in_stack_fffffffffffffcb8 =
             (CodeLocation *)
             SuiteApiResolver<(anonymous_namespace)::LowBDConvolveScaleTest>::GetSetUpCaseOrSuite
                       (filename,iVar3);
        in_stack_fffffffffffffcc0 =
             (CodeLocation *)
             SuiteApiResolver<(anonymous_namespace)::LowBDConvolveScaleTest>::GetTearDownCaseOrSuite
                       (filename,(int)((ulong)in_stack_fffffffffffffcb8 >> 0x20));
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0xd80583);
        in_stack_fffffffffffffcf0 =
             std::
             unique_ptr<testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>_>_>
             ::operator->((unique_ptr<testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>_>_>
                           *)0xd8058f);
        ptVar9 = ParamIterator<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
                 ::operator*((ParamIterator<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
                              *)0xd805a1);
        local_1d8._M_head_impl =
             (ptVar9->
             super__Tuple_impl<0UL,_void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>
             ).super__Tuple_impl<1UL,_std::tuple<int,_int>_>.
             super__Head_base<1UL,_std::tuple<int,_int>,_false>._M_head_impl.
             super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
             super__Head_base<1UL,_int,_false>._M_head_impl;
        iStack_1d4 = (ptVar9->
                     super__Tuple_impl<0UL,_void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>
                     ).super__Tuple_impl<1UL,_std::tuple<int,_int>_>.
                     super__Head_base<1UL,_std::tuple<int,_int>,_false>._M_head_impl.
                     super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl
        ;
        uStack_1d0 = *(undefined4 *)
                      &(ptVar9->
                       super__Tuple_impl<0UL,_void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>
                       ).
                       super__Head_base<0UL,_void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_false>
                       ._M_head_impl;
        uStack_1cc = *(undefined4 *)
                      ((long)&(ptVar9->
                              super__Tuple_impl<0UL,_void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>
                              ).
                              super__Head_base<0UL,_void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_false>
                              ._M_head_impl + 4);
        iVar3 = (*in_stack_fffffffffffffcf0->_vptr_TestMetaFactoryBase[2])
                          (in_stack_fffffffffffffcf0,&local_1d8);
        in_stack_fffffffffffffcc8 = (string *)CONCAT44(extraout_var,iVar3);
        in_stack_fffffffffffffce8 = in_stack_fffffffffffffcc8;
        in_stack_fffffffffffffd08 = in_stack_fffffffffffffcb8;
        MakeAndRegisterTestInfo
                  ((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (char *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
                   in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                   (SetUpTestSuiteFunc)CONCAT17(condition,CONCAT16(uVar2,in_stack_fffffffffffffdd0))
                   ,(TearDownTestSuiteFunc)tear_down_tc,(TestFactoryBase *)a_param);
        CodeLocation::~CodeLocation((CodeLocation *)0xd80626);
        std::__cxx11::string::~string(local_1a0);
        std::__cxx11::string::~string(local_180);
        std::__cxx11::string::~string((string *)local_130);
        Message::~Message((Message *)0xd8065a);
        ParamIterator<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
        ::operator++((ParamIterator<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
                      *)in_stack_fffffffffffffcc0);
        local_c8 = local_c8 + 1;
      }
      ParamIterator<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
      ::~ParamIterator((ParamIterator<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
                        *)0xd7ffac);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xd8071f);
      std::__cxx11::string::~string(local_a0);
      ParamGenerator<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
      ::~ParamGenerator((ParamGenerator<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
                         *)0xd80739);
      __gnu_cxx::
      __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::InstantiationInfo>_>_>
      ::operator++(local_38);
    }
    std::
    shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>
    ::~shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>
                   *)0xd80781);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>_>_>_>
    ::operator++(&local_18);
  }
  if ((local_9 & 1) == 0) {
    (**(code **)(*in_RDI + 0x10))();
    CodeLocation::CodeLocation(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    std::
    vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>_>_>
    ::empty((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LowBDConvolveScaleTest>::TestInfo>_>_>
             *)in_stack_fffffffffffffcd0);
    InsertSyntheticTestCase(in_stack_00000130,in_stack_00000128,in_stack_00000127);
    CodeLocation::~CodeLocation((CodeLocation *)0xd8081b);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin();
           gen_it != instantiations_.end(); ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name =
              name_func(TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }    // for gen_it
    }      // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }